

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O1

void gola_fixup(LexState *ls,FuncScope *bl)

{
  uint8_t *puVar1;
  uint uVar2;
  uint list;
  FuncState *fs;
  VarInfo *pVVar3;
  VarInfo *pVVar4;
  VarInfo *vg;
  VarInfo *vg_00;
  
  if (bl->vstart < ls->vtop) {
    pVVar4 = ls->vstack + ls->vtop;
    vg_00 = ls->vstack + bl->vstart;
    do {
      uVar2 = (vg_00->name).gcptr32;
      if ((ulong)uVar2 != 0) {
        if ((vg_00->info & 4) == 0) {
          if ((vg_00->info & 2) != 0) {
            if (bl->prev == (FuncScope *)0x0) {
              ls->linenumber = ls->fs->bcbase[vg_00->startpc].line;
              if (uVar2 != 1) {
                lj_lex_error(ls,0,LJ_ERR_XLUNDEF,(ulong)uVar2 + 0x10);
              }
              lj_lex_error(ls,0,LJ_ERR_XBREAK);
            }
            puVar1 = &bl->prev->flags;
            *puVar1 = *puVar1 | (uVar2 != 1) * '\x02' + 2U;
            vg_00->slot = bl->nactvar;
            if ((bl->flags & 8) != 0) {
              gola_close(ls,vg_00);
            }
          }
        }
        else {
          (vg_00->name).gcptr32 = 0;
          vg = vg_00;
          while (pVVar3 = vg, vg = pVVar3 + 1, vg < pVVar4) {
            if (((vg->name).gcptr32 == uVar2) && ((pVVar3[1].info & 2) != 0)) {
              if (((bl->flags & 8) != 0) && (vg_00->slot < pVVar3[1].slot)) {
                gola_close(ls,vg);
              }
              fs = ls->fs;
              list = pVVar3[1].startpc;
              (vg->name).gcptr32 = 0;
              *(uint8_t *)((long)&fs->bcbase[list].ins + 1) = vg_00->slot;
              jmp_patch(fs,list,vg_00->startpc);
            }
          }
        }
      }
      vg_00 = vg_00 + 1;
    } while (vg_00 < pVVar4);
  }
  return;
}

Assistant:

static void gola_fixup(LexState *ls, FuncScope *bl)
{
  VarInfo *v = ls->vstack + bl->vstart;
  VarInfo *ve = ls->vstack + ls->vtop;
  for (; v < ve; v++) {
    GCstr *name = strref(v->name);
    if (name != NULL) {  /* Only consider remaining valid gotos/labels. */
      if (gola_islabel(v)) {
	VarInfo *vg;
	setgcrefnull(v->name);  /* Invalidate label that goes out of scope. */
	for (vg = v+1; vg < ve; vg++)  /* Resolve pending backward gotos. */
	  if (strref(vg->name) == name && gola_isgoto(vg)) {
	    if ((bl->flags&FSCOPE_UPVAL) && vg->slot > v->slot)
	      gola_close(ls, vg);
	    gola_patch(ls, vg, v);
	  }
      } else if (gola_isgoto(v)) {
	if (bl->prev) {  /* Propagate goto or break to outer scope. */
	  bl->prev->flags |= name == NAME_BREAK ? FSCOPE_BREAK : FSCOPE_GOLA;
	  v->slot = bl->nactvar;
	  if ((bl->flags & FSCOPE_UPVAL))
	    gola_close(ls, v);
	} else {  /* No outer scope: undefined goto label or no loop. */
	  ls->linenumber = ls->fs->bcbase[v->startpc].line;
	  if (name == NAME_BREAK)
	    lj_lex_error(ls, 0, LJ_ERR_XBREAK);
	  else
	    lj_lex_error(ls, 0, LJ_ERR_XLUNDEF, strdata(name));
	}
      }
    }
  }
}